

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void string_replace_all(string *s,string *search,string *replace)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong in_RSI;
  string *in_RDI;
  size_t last_pos;
  size_t pos;
  string builder;
  ulong local_58;
  string local_38 [40];
  ulong local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_38);
    std::__cxx11::string::length();
    std::__cxx11::string::reserve((ulong)local_38);
    local_58 = 0;
    while (lVar2 = std::__cxx11::string::find(local_8,local_10), lVar2 != -1) {
      std::__cxx11::string::append(local_38,(ulong)local_8,local_58);
      std::__cxx11::string::append(local_38);
      lVar3 = std::__cxx11::string::length();
      local_58 = lVar2 + lVar3;
    }
    std::__cxx11::string::append(local_38,(ulong)local_8,local_58);
    std::__cxx11::string::operator=(local_8,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void string_replace_all(std::string & s, const std::string & search, const std::string & replace) {
    if (search.empty()) {
        return;
    }
    std::string builder;
    builder.reserve(s.length());
    size_t pos = 0;
    size_t last_pos = 0;
    while ((pos = s.find(search, last_pos)) != std::string::npos) {
        builder.append(s, last_pos, pos - last_pos);
        builder.append(replace);
        last_pos = pos + search.length();
    }
    builder.append(s, last_pos, std::string::npos);
    s = std::move(builder);
}